

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigfile-mpi.c
# Opt level: O2

int big_file_mpi_broadcast_anyerror(int rt,MPI_Comm comm)

{
  int iVar1;
  char *__s;
  size_t sVar2;
  long lVar3;
  int root;
  int rank;
  int loc;
  int errorlen;
  int rt_local;
  
  rt_local = rt;
  MPI_Comm_rank(comm,&rank);
  loc = 0;
  if (rt != 0) {
    loc = rank + 1;
  }
  MPI_Allreduce(&loc,&root,1,&ompi_mpi_int,&ompi_mpi_op_max,comm);
  if (root == 0) {
    rt_local = 0;
  }
  else {
    root = root + -1;
    __s = big_file_get_error_message();
    iVar1 = root;
    if (rank == root) {
      sVar2 = strlen(__s);
      errorlen = (int)sVar2;
    }
    MPI_Bcast(&errorlen,1,&ompi_mpi_int,iVar1,comm);
    iVar1 = root;
    lVar3 = (long)errorlen;
    if (rank != root) {
      __s = (char *)malloc(lVar3 + 1U);
    }
    MPI_Bcast(__s,lVar3 + 1U & 0xffffffff,&ompi_mpi_byte,iVar1,comm);
    if (rank != root) {
      big_file_set_error_message(__s);
      free(__s);
      rank = root;
    }
    MPI_Bcast(&rt_local,1,&ompi_mpi_int,rank,comm);
  }
  return rt_local;
}

Assistant:

static int
big_file_mpi_broadcast_anyerror(int rt, MPI_Comm comm)
{
    int rank;
    MPI_Comm_rank(comm, &rank);
    int root, loc = 0;
    /* Add 1 so we do not swallow errors on rank 0*/
    if(rt != 0)
        loc = rank+1;

    MPI_Allreduce(&loc, &root, 1, MPI_INT, MPI_MAX, comm);

    if (root == 0) {
        /* no errors */
        return 0;
    }

    root -= 1;
    char * error = big_file_get_error_message();

    int errorlen;
    if(rank == root) {
        errorlen = strlen(error);
    }
    MPI_Bcast(&errorlen, 1, MPI_INT, root, comm);

    if(rank != root) {
        error = malloc(errorlen + 1);
    }

    MPI_Bcast(error, errorlen + 1, MPI_BYTE, root, comm);

    if(rank != root) {
        big_file_set_error_message(error);
        free(error);
    }

    MPI_Bcast(&rt, 1, MPI_INT, root, comm);

    return rt;
}